

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2contains_point_query.h
# Opt level: O0

bool __thiscall
S2ContainsPointQuery<S2ShapeIndex>::Contains(S2ContainsPointQuery<S2ShapeIndex> *this,S2Point *p)

{
  bool bVar1;
  int iVar2;
  S2ShapeIndexCell *this_00;
  S2ClippedShape *clipped;
  int local_30;
  int s;
  int num_clipped;
  S2ShapeIndexCell *cell;
  S2Point *p_local;
  S2ContainsPointQuery<S2ShapeIndex> *this_local;
  
  bVar1 = S2ShapeIndex::Iterator::Locate(&this->it_,p);
  if (bVar1) {
    this_00 = S2ShapeIndex::Iterator::cell(&this->it_);
    iVar2 = S2ShapeIndexCell::num_clipped(this_00);
    for (local_30 = 0; local_30 < iVar2; local_30 = local_30 + 1) {
      clipped = S2ShapeIndexCell::clipped(this_00,local_30);
      bVar1 = ShapeContains(this,&this->it_,clipped,p);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool S2ContainsPointQuery<IndexType>::Contains(const S2Point& p) {
  if (!it_.Locate(p)) return false;

  const S2ShapeIndexCell& cell = it_.cell();
  int num_clipped = cell.num_clipped();
  for (int s = 0; s < num_clipped; ++s) {
    if (ShapeContains(it_, cell.clipped(s), p)) return true;
  }
  return false;
}